

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

int __thiscall cmCursesMainForm::Generate(cmCursesMainForm *this)

{
  bool bVar1;
  int iVar2;
  cmCursesLongMessageForm *this_00;
  uint local_8c;
  uint local_88;
  int local_84;
  uint local_78;
  uint local_74;
  cmCursesLongMessageForm *msgs;
  char *title;
  int yy;
  int xx;
  int retVal;
  uint local_20;
  uint local_1c;
  int yi;
  int xi;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_74 = 0xffffffff;
  }
  else {
    local_74 = (int)*(short *)(_stdscr + 4) + 1;
  }
  local_20 = local_74;
  if (_stdscr == 0) {
    local_78 = 0xffffffff;
  }
  else {
    local_78 = (int)*(short *)(_stdscr + 6) + 1;
  }
  local_1c = local_78;
  _yi = this;
  curses_move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Generating, please wait...");
  PrintKeys(this,1);
  if (_stdscr == 0) {
    local_84 = -1;
  }
  else {
    local_84 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_84,1);
  refresh();
  cmake::SetProgressCallback(this->CMakeInstance,UpdateProgress,this);
  memset(&xx,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&xx);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Errors,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&xx);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&xx);
  iVar2 = cmake::Generate(this->CMakeInstance);
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType)0x0,(void *)0x0);
  keypad(_stdscr,1);
  if ((iVar2 != 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Errors), !bVar1)) {
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    cmSystemTools::ResetErrorOccuredFlag();
    if (_stdscr == 0) {
      local_88 = 0xffffffff;
      local_8c = 0xffffffff;
    }
    else {
      local_88 = (int)*(short *)(_stdscr + 4) + 1;
      local_8c = (int)*(short *)(_stdscr + 6) + 1;
    }
    msgs = (cmCursesLongMessageForm *)anon_var_dwarf_15b1e;
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      msgs = (cmCursesLongMessageForm *)anon_var_dwarf_15ad9;
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Errors,(char *)msgs);
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this_00,1,1,(ulong)local_8c,(ulong)local_88);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])();
    if (iVar2 == -2) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_8c,(ulong)local_88);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_1c,(ulong)local_20);
  return 0;
}

Assistant:

int cmCursesMainForm::Generate()
{
  int xi,yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1,1);
  this->UpdateStatusBar("Generating, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(cmCursesMainForm::UpdateProgress, this);

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  int retVal = this->CMakeInstance->Generate();

  this->CMakeInstance->SetProgressCallback(0, 0);
  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  if( retVal != 0 || !this->Errors.empty())
    {
    // see if there was an error
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      this->OkToGenerate = false;
      }
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    int xx,yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Messages during last pass.";
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      title = "Errors occurred during the last pass.";
      }
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->Errors,
                                                                title);
    CurrentForm = msgs;
    msgs->Render(1,1,xx,yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if ( retVal == -2 )
      {
      return retVal;
      }
    CurrentForm = this;
    this->Render(1,1,xx,yy);
    }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}